

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

TcParseTableBase * __thiscall google::protobuf::Reflection::CreateTcParseTable(Reflection *this)

{
  ReflectionSchema *this_00;
  pointer pSVar1;
  undefined2 uVar2;
  pointer pFVar3;
  pointer pFVar4;
  bool bVar5;
  uint32_t uVar6;
  FieldDescriptor *field;
  ulong uVar7;
  Nullable<const_char_*> pcVar8;
  TcParseTableBase *pTVar9;
  undefined4 extraout_var;
  TailCallParseFunc p_Var10;
  SkipEntry16 *pSVar11;
  pointer puVar12;
  uint uVar13;
  SkipEntryBlock *entry_block;
  int i;
  int iVar14;
  const_iterator __begin3;
  pointer pSVar15;
  const_iterator __end3;
  __normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldOptions_*,_std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>_>
  __i;
  long lVar16;
  pointer pFVar17;
  long lVar18;
  uint uVar19;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields;
  uint16_t local_124;
  uint16_t local_120;
  uint32_t local_11c;
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  fields;
  LogMessageFatal local_f8;
  pointer local_e8;
  pointer local_e0;
  ulong local_d8;
  ulong local_d0;
  int local_c4;
  TailCallTableInfo table_info;
  
  fields.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fields.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ::reserve(&fields,(long)this->descriptor_->field_count_);
  this_00 = &this->schema_;
  for (iVar14 = 0;
      pFVar4 = fields.
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      pFVar3 = fields.
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
               ._M_impl.super__Vector_impl_data._M_start, iVar14 < this->descriptor_->field_count_;
      iVar14 = iVar14 + 1) {
    field = Descriptor::field(this->descriptor_,iVar14);
    bVar5 = internal::ReflectionSchema::IsFieldInlined(this_00,field);
    table_info._0_8_ = field;
    table_info.fast_path_fields.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ =
         internal::ReflectionSchema::HasBitIndex(this_00,field);
    table_info.fast_path_fields.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0x3f800000;
    table_info.fast_path_fields.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
    table_info.fast_path_fields.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._3_2_ = 0;
    table_info.fast_path_fields.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._2_1_ = bVar5;
    table_info.fast_path_fields.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._5_1_ =
         internal::ReflectionSchema::IsSplit(this_00,field);
    uVar6 = 0xffffffff;
    if (bVar5) {
      uVar6 = internal::ReflectionSchema::InlinedStringIndex(this_00,field);
    }
    table_info.fast_path_fields.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
    table_info.fast_path_fields.
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = uVar6;
    std::
    vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
    ::emplace_back<google::protobuf::internal::TailCallTableInfo::FieldOptions>
              (&fields,(FieldOptions *)&table_info);
  }
  if (fields.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      fields.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar16 = (long)fields.
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)fields.
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = lVar16 >> 5;
    lVar18 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldOptions*,std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::Reflection::CreateTcParseTable()const::__0>>
              (fields.
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
               ._M_impl.super__Vector_impl_data._M_start,
               fields.
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar16 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldOptions*,std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::Reflection::CreateTcParseTable()const::__0>>
                (pFVar3,pFVar4);
    }
    else {
      pFVar17 = pFVar3 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldOptions*,std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::Reflection::CreateTcParseTable()const::__0>>
                (pFVar3,pFVar17);
      for (; pFVar17 != pFVar4; pFVar17 = pFVar17 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldOptions*,std::vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::Reflection::CreateTcParseTable()const::__0>>
                  (pFVar17);
      }
    }
  }
  local_f8.super_LogMessage._0_8_ = local_f8.super_LogMessage._0_8_ & 0xffffffffffff0000;
  ordered_fields.len_ =
       (long)fields.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)fields.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  ordered_fields.ptr_ =
       fields.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
       ._M_impl.super__Vector_impl_data._M_start;
  internal::TailCallTableInfo::TailCallTableInfo
            (&table_info,this->descriptor_,(MessageOptions *)&local_f8,ordered_fields);
  lVar18 = CONCAT26(table_info.fast_path_fields.
                    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish._6_2_,
                    CONCAT15(table_info.fast_path_fields.
                             super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish._5_1_,
                             CONCAT23(table_info.fast_path_fields.
                                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._3_2_,
                                      CONCAT12(table_info.fast_path_fields.
                                               super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._2_1_,
                                               table_info.fast_path_fields.
                                               super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_2_))))
           - CONCAT44(table_info.fast_path_fields.
                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      (uint32_t)
                      table_info.fast_path_fields.
                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start) >> 5;
  iVar14 = (int)lVar18;
  pcVar8 = absl::lts_20250127::log_internal::Check_EQImpl
                     (iVar14,1 << ((byte)table_info.table_size_log2 & 0x1f),
                      "static_cast<int>(fast_entries_count) == 1 << table_info.table_size_log2");
  if (pcVar8 == (Nullable<const_char_*>)0x0) {
    uVar19 = iVar14 * 0x10 + 0x39U & 0xfff8;
    iVar14 = internal::TailCallTableInfo::NumToEntryTable::size16(&table_info.num_to_entry_table);
    uVar13 = uVar19 + 2 + iVar14 * 2 & 0xfffffffc;
    local_d0 = (ulong)uVar13;
    local_d8 = (ulong)(uVar13 + (int)((ulong)((long)fields.
                                                  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)fields.
                                                  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5) *
                                0xc + 7 & 0xfffffff8);
    local_e8 = table_info.field_name_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish +
               local_d8 +
               ((CONCAT44(table_info.aux_entries.
                          super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                          (int)table_info.aux_entries.
                               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish) -
                 CONCAT44(table_info.aux_entries.
                          super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)table_info.aux_entries.
                               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 1) -
               (long)table_info.field_name_data.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    pTVar9 = (TcParseTableBase *)operator_new((long)(int)local_e8);
    if ((this->schema_).has_bits_offset_ == -1) {
      local_120 = 0;
    }
    else {
      uVar6 = internal::ReflectionSchema::HasBitsOffset(this_00);
      local_120 = (uint16_t)uVar6;
    }
    local_11c = 0;
    if ((this->schema_).extensions_offset_ == -1) {
      local_124 = 0;
    }
    else {
      uVar6 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
      local_124 = (uint16_t)uVar6;
    }
    pFVar3 = fields.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_e0 = fields.
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (fields.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        fields.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_11c = (fields.
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].field)->number_;
    }
    iVar14 = (*(this_00->default_instance_->super_MessageLite)._vptr_MessageLite[4])();
    p_Var10 = GetFastParseFunction(table_info.fallback_function);
    pTVar9->has_bits_offset = local_120;
    pTVar9->extension_offset = local_124;
    pTVar9->max_field_number = local_11c;
    pTVar9->fast_idx_mask = (char)lVar18 * '\b' + 0xf8;
    pTVar9->field_0x9 = pTVar9->field_0x9 & 0xfe;
    pTVar9->lookup_table_offset = (uint16_t)uVar19;
    pTVar9->skipmap32 = table_info.num_to_entry_table.skipmap32;
    pTVar9->field_entries_offset = (uint32_t)local_d0;
    pTVar9->num_field_entries = (uint16_t)((uint)((int)pFVar3 - (int)local_e0) >> 5);
    pTVar9->num_aux_entries =
         (uint16_t)
         ((uint)((int)table_info.aux_entries.
                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (int)table_info.aux_entries.
                     super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
    pTVar9->aux_offset = (uint32_t)local_d8;
    pTVar9->class_data = (ClassData *)CONCAT44(extraout_var,iVar14);
    pTVar9->post_loop_handler = (PostLoopHandler)0x0;
    pTVar9->fallback = p_Var10;
    PopulateTcParseFastEntries(this,&table_info,(FastFieldEntry *)(pTVar9 + 1));
    pSVar11 = (SkipEntry16 *)((long)&pTVar9->has_bits_offset + (ulong)pTVar9->lookup_table_offset);
    for (; table_info.num_to_entry_table.blocks.
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           table_info.num_to_entry_table.blocks.
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        table_info.num_to_entry_table.blocks.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
        ._M_impl.super__Vector_impl_data._M_start =
             table_info.num_to_entry_table.blocks.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      uVar2 = *(undefined2 *)
               ((long)&(table_info.num_to_entry_table.blocks.
                        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first_fnum + 2);
      pSVar11->skipmap =
           *(undefined2 *)
            &(table_info.num_to_entry_table.blocks.
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
              ._M_impl.super__Vector_impl_data._M_start)->first_fnum;
      pSVar11->field_entry_offset = uVar2;
      pSVar15 = ((table_info.num_to_entry_table.blocks.
                  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                  ._M_impl.super__Vector_impl_data._M_start)->entries).
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar1 = ((table_info.num_to_entry_table.blocks.
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
                 ._M_impl.super__Vector_impl_data._M_start)->entries).
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pSVar11[1].skipmap = (uint16_t)((uint)((int)pSVar1 - (int)pSVar15) >> 2);
      pSVar11 = (SkipEntry16 *)&pSVar11[1].field_entry_offset;
      for (; pSVar15 != pSVar1; pSVar15 = pSVar15 + 1) {
        *pSVar11 = *pSVar15;
        pSVar11 = pSVar11 + 1;
      }
    }
    pSVar11->skipmap = 0xffff;
    pSVar11->field_entry_offset = 0xffff;
    PopulateTcParseEntries
              (this,&table_info,
               (FieldEntry *)((long)&pTVar9->has_bits_offset + (ulong)pTVar9->field_entries_offset))
    ;
    PopulateTcParseFieldAux
              (this,&table_info,
               (FieldAux *)((long)&pTVar9->has_bits_offset + (ulong)pTVar9->aux_offset));
    puVar12 = table_info.field_name_data.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (table_info.field_name_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        table_info.field_name_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      memcpy((void *)((long)&pTVar9->has_bits_offset +
                     (ulong)pTVar9->num_aux_entries * 8 + (ulong)pTVar9->aux_offset),
             table_info.field_name_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)table_info.field_name_data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)table_info.field_name_data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
      puVar12 = table_info.field_name_data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    local_f8.super_LogMessage._0_8_ =
         puVar12 + (((ulong)pTVar9->aux_offset + (ulong)pTVar9->num_aux_entries * 8) -
                   (long)table_info.field_name_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
    local_c4 = (int)local_e8;
    pcVar8 = absl::lts_20250127::log_internal::Check_EQImpl<long,int>
                       ((long *)&local_f8,&local_c4,
                        "res->name_data() + table_info.field_name_data.size() - reinterpret_cast<char*>(res) == byte_size"
                       );
    if (pcVar8 == (Nullable<const_char_*>)0x0) {
      internal::TailCallTableInfo::~TailCallTableInfo(&table_info);
      std::
      _Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
      ::~_Vector_base(&fields.
                       super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                     );
      return pTVar9;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xe82,pcVar8);
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xe44,pcVar8);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_f8);
}

Assistant:

const internal::TcParseTableBase* Reflection::CreateTcParseTable() const {
  using TcParseTableBase = internal::TcParseTableBase;

  constexpr int kNoHasbit = -1;
  std::vector<internal::TailCallTableInfo::FieldOptions> fields;
  fields.reserve(descriptor_->field_count());
  for (int i = 0; i < descriptor_->field_count(); ++i) {
    auto* field = descriptor_->field(i);
    const bool is_inlined = IsInlined(field);
    fields.push_back({
        field,  //
        static_cast<int>(schema_.HasBitIndex(field)),
        1.f,  // All fields are assumed present.
        GetLazyStyle(field),
        is_inlined,
        // Only LITE can be implicitly weak.
        /* is_implicitly_weak */ false,
        // We could change this to use direct table.
        // Might be easier to do when all messages support TDP.
        /* use_direct_tcparser_table */ false,
        schema_.IsSplit(field),
        is_inlined ? static_cast<int>(schema_.InlinedStringIndex(field))
                   : kNoHasbit,
        field->cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
            IsMicroString(field),
    });
  }
  std::sort(fields.begin(), fields.end(), [](const auto& a, const auto& b) {
    return a.field->number() < b.field->number();
  });

  internal::TailCallTableInfo table_info(
      descriptor_,
      {
          /* is_lite */ false,
          /* uses_codegen */ false,
      },
      fields);

  const size_t fast_entries_count = table_info.fast_path_fields.size();
  ABSL_CHECK_EQ(static_cast<int>(fast_entries_count),
                1 << table_info.table_size_log2);
  const uint16_t lookup_table_offset = AlignTo<uint16_t>(
      sizeof(TcParseTableBase) +
      fast_entries_count * sizeof(TcParseTableBase::FastFieldEntry));
  const uint32_t field_entry_offset = AlignTo<TcParseTableBase::FieldEntry>(
      lookup_table_offset +
      sizeof(uint16_t) * table_info.num_to_entry_table.size16());
  const uint32_t aux_offset = AlignTo<TcParseTableBase::FieldAux>(
      field_entry_offset +
      sizeof(TcParseTableBase::FieldEntry) * fields.size());

  int byte_size =
      aux_offset +
      sizeof(TcParseTableBase::FieldAux) * table_info.aux_entries.size() +
      sizeof(char) * table_info.field_name_data.size();

  void* p = ::operator new(byte_size);
  auto* res = ::new (p) TcParseTableBase{
      static_cast<uint16_t>(schema_.HasHasbits() ? schema_.HasBitsOffset() : 0),
      schema_.HasExtensionSet()
          ? static_cast<uint16_t>(schema_.GetExtensionSetOffset())
          : uint16_t{0},
      static_cast<uint32_t>(fields.empty() ? 0 : fields.back().field->number()),
      static_cast<uint8_t>((fast_entries_count - 1) << 3),
      lookup_table_offset,
      table_info.num_to_entry_table.skipmap32,
      field_entry_offset,
      static_cast<uint16_t>(fields.size()),
      static_cast<uint16_t>(table_info.aux_entries.size()),
      aux_offset,
      schema_.default_instance_->GetClassData(),
      nullptr,
      GetFastParseFunction(table_info.fallback_function)
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
          ,
      nullptr
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE
  };
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
  // We'll prefetch `to_prefetch->to_prefetch` unconditionally to avoid
  // branches. Here we don't know which field is the hottest, so set the pointer
  // to itself to avoid nullptr.
  res->to_prefetch = res;
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE

  // Now copy the rest of the payloads
  PopulateTcParseFastEntries(table_info, res->fast_entry(0));

  PopulateTcParseLookupTable(table_info, res->field_lookup_begin());

  PopulateTcParseEntries(table_info, res->field_entries_begin());

  PopulateTcParseFieldAux(table_info, res->field_aux(0u));

  // Copy the name data.
  if (!table_info.field_name_data.empty()) {
    memcpy(res->name_data(), table_info.field_name_data.data(),
           table_info.field_name_data.size());
  }
  // Validation to make sure we used all the bytes correctly.
  ABSL_CHECK_EQ(res->name_data() + table_info.field_name_data.size() -
                    reinterpret_cast<char*>(res),
                byte_size);

  return res;
}